

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O3

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  BadNameString *pBVar4;
  pointer pbVar5;
  undefined1 *puVar6;
  long lVar7;
  pointer pbVar8;
  long lVar9;
  bool bVar10;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  string pos_name;
  value_type local_160;
  int local_140;
  undefined4 uStack_13c;
  long local_138;
  undefined1 local_130 [16];
  pointer local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  pbVar8 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar5) {
    local_120 = pbVar5;
    local_d8 = (_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                *)__return_storage_ptr__;
    do {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      pcVar1 = (pbVar8->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar1,pcVar1 + pbVar8->_M_string_length);
      if (local_160._M_string_length != 0) {
        if (local_160._M_string_length != 1) {
          if ((*local_160._M_dataplus._M_p == '-') && (local_160._M_dataplus._M_p[1] != '-')) {
            if ((local_160._M_string_length != 2) ||
               (bVar2 = valid_first_char<char>(local_160._M_dataplus._M_p[1]), !bVar2)) {
              pBVar4 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,local_160._M_dataplus._M_p,
                         local_160._M_dataplus._M_p + local_160._M_string_length);
              BadNameString::OneCharName(pBVar4,&local_50);
              __cxa_throw(pBVar4,&BadNameString::typeinfo,Error::~Error);
            }
            local_140 = 1;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_f8,&local_140,local_160._M_dataplus._M_p + 1);
            goto LAB_001075e1;
          }
          if (2 < local_160._M_string_length) {
            ::std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_160);
            iVar3 = ::std::__cxx11::string::compare((char *)&local_140);
            if ((undefined1 *)CONCAT44(uStack_13c,local_140) != local_130) {
              operator_delete((undefined1 *)CONCAT44(uStack_13c,local_140));
            }
            pbVar5 = local_120;
            if (iVar3 == 0) {
              ::std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_160);
              ::std::__cxx11::string::operator=((string *)&local_160,(string *)&local_140);
              if ((undefined1 *)CONCAT44(uStack_13c,local_140) != local_130) {
                operator_delete((undefined1 *)CONCAT44(uStack_13c,local_140));
              }
              if ((local_160._M_string_length == 0) ||
                 (bVar2 = valid_first_char<char>(*local_160._M_dataplus._M_p), !bVar2)) {
LAB_001078b0:
                pBVar4 = (BadNameString *)__cxa_allocate_exception(0x38);
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,local_160._M_dataplus._M_p,
                           local_160._M_dataplus._M_p + local_160._M_string_length);
                BadNameString::BadLongName(pBVar4,&local_70);
                __cxa_throw(pBVar4,&BadNameString::typeinfo,Error::~Error);
              }
              ::std::__cxx11::string::substr((ulong)&local_140,(ulong)&local_160);
              puVar6 = (undefined1 *)CONCAT44(uStack_13c,local_140);
              if (local_138 == 0) {
                bVar2 = true;
              }
              else {
                lVar9 = local_138 + -1;
                lVar7 = 0;
                do {
                  bVar2 = valid_later_char<char>(puVar6[lVar7]);
                  bVar10 = lVar9 != lVar7;
                  lVar7 = lVar7 + 1;
                } while (bVar2 && bVar10);
                puVar6 = (undefined1 *)CONCAT44(uStack_13c,local_140);
              }
              if (puVar6 != local_130) {
                operator_delete(puVar6);
              }
              __return_storage_ptr__ =
                   (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d8;
              pbVar5 = local_120;
              if (bVar2 == false) goto LAB_001078b0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_118,&local_160);
              goto LAB_001075e1;
            }
          }
        }
        iVar3 = ::std::__cxx11::string::compare((char *)&local_160);
        if ((iVar3 == 0) ||
           (iVar3 = ::std::__cxx11::string::compare((char *)&local_160), iVar3 == 0)) {
          pBVar4 = (BadNameString *)__cxa_allocate_exception(0x38);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_160._M_dataplus._M_p,
                     local_160._M_dataplus._M_p + local_160._M_string_length);
          BadNameString::DashesOnly(pBVar4,&local_90);
          __cxa_throw(pBVar4,&BadNameString::typeinfo,Error::~Error);
        }
        if (local_d0._M_string_length != 0) {
          pBVar4 = (BadNameString *)__cxa_allocate_exception(0x38);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_160._M_dataplus._M_p,
                     local_160._M_dataplus._M_p + local_160._M_string_length);
          BadNameString::MultiPositionalNames(pBVar4,&local_b0);
          __cxa_throw(pBVar4,&BadNameString::typeinfo,Error::~Error);
        }
        ::std::__cxx11::string::_M_assign((string *)&local_d0);
      }
LAB_001075e1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar5);
  }
  ::std::
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  ::
  _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
            ((_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
              *)__return_storage_ptr__,&local_f8,&local_118,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
             *)__return_storage_ptr__;
}

Assistant:

inline std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;

    for(std::string name : input) {
        if(name.length() == 0)
            continue;
        else if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--") {
            throw BadNameString::DashesOnly(name);
        } else {
            if(pos_name.length() > 0)
                throw BadNameString::MultiPositionalNames(name);
            pos_name = name;
        }
    }

    return std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>(
        short_names, long_names, pos_name);
}